

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O3

void __thiscall
TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ValueArg(ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,string *flag,string *name,string *desc,bool req,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,string *typeDesc,
        Visitor *v)

{
  pointer pcVar1;
  
  Arg::Arg(&this->super_Arg,flag,name,desc,req,true,v);
  (this->super_Arg)._vptr_Arg = (_func_int **)&PTR__ValueArg_001569c8;
  (this->_value)._M_dataplus._M_p = (pointer)&(this->_value).field_2;
  pcVar1 = (val->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_value,pcVar1,pcVar1 + val->_M_string_length);
  (this->_default)._M_dataplus._M_p = (pointer)&(this->_default).field_2;
  pcVar1 = (val->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_default,pcVar1,pcVar1 + val->_M_string_length);
  (this->_typeDesc)._M_dataplus._M_p = (pointer)&(this->_typeDesc).field_2;
  pcVar1 = (typeDesc->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_typeDesc,pcVar1,pcVar1 + typeDesc->_M_string_length);
  this->_constraint =
       (Constraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  return;
}

Assistant:

ValueArg<T>::ValueArg(const std::string& flag, 
                      const std::string& name, 
                      const std::string& desc, 
                      bool req, 
                      T val,
                      const std::string& typeDesc,
                      Visitor* v)
: Arg(flag, name, desc, req, true, v),
  _value( val ),
  _default( val ),
  _typeDesc( typeDesc ),
  _constraint( NULL )
{ }